

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *value;
  Edition value_00;
  int *piVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  SourceCodeInfo *other;
  undefined8 uVar5;
  ulong uVar6;
  Arena *pAVar7;
  byte bVar8;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogMessage local_a0 [16];
  LocationRecorder local_90;
  SourceCodeInfo local_78;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_78,(Arena *)0x0);
  this->source_code_info_ = &local_78;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_90,this);
  LocationRecorder::RecordLegacyLocation(&local_90,&file->super_Message,OTHER);
  value = &this->syntax_identifier_;
  if (this->require_syntax_identifier_ == false) {
    piVar1 = (int *)(this->input_->current_).text._M_dataplus._M_p;
    sVar2 = (this->input_->current_).text._M_string_length;
    if (sVar2 == 7) {
      if (*(int *)((long)piVar1 + 3) != 0x6e6f6974 || *piVar1 != 0x74696465) goto LAB_001cf351;
      goto LAB_001cf291;
    }
    if ((sVar2 == 6) && ((short)piVar1[1] == 0x7861 && *piVar1 == 0x746e7973)) goto LAB_001cf291;
LAB_001cf351:
    if (this->stop_after_syntax_identifier_ == false) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                 ,0x2ae);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (local_a0,0x28,"No syntax specified for the proto file: ");
      uVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (local_a0,(string *)
                                  ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                  0xfffffffffffffffc));
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar5,0x22,". Please use \'syntax = \"proto2\";\' ");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar5,0x2c,"or \'syntax = \"proto3\";\' to specify a syntax ");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (uVar5,0x26,"version. (Defaulted to proto2 syntax.)");
      absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_a0);
      std::__cxx11::string::operator=((string *)value,"proto2");
    }
LAB_001cf35b:
    if (this->stop_after_syntax_identifier_ == false) {
      if ((this->input_->current_).type != TYPE_END) {
        do {
          bVar3 = ParseTopLevelStatement(this,file,&local_90);
          if (!bVar3) {
            SkipStatement(this);
            if (((this->input_->current_).text._M_string_length == 1) &&
               (*(this->input_->current_).text._M_dataplus._M_p == '}')) {
              RecordError(this,(ErrorMaker)ZEXT816(0x335826));
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                         &this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      LocationRecorder::~LocationRecorder(&local_90);
      this->input_ = (Tokenizer *)0x0;
      this->source_code_info_ = (SourceCodeInfo *)0x0;
      if (file == (FileDescriptorProto *)0x0) {
        __assert_fail("file != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                      ,0x2ca,
                      "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                     );
      }
      *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x10;
      other = (file->field_0)._impl_.source_code_info_;
      if (other == (SourceCodeInfo *)0x0) {
        pAVar7 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
        }
        other = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(pAVar7);
        (file->field_0)._impl_.source_code_info_ = other;
      }
      if (other != &local_78) {
        if ((local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
          local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ =
               *(ulong *)(local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                         0xfffffffffffffffe);
        }
        uVar6 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if ((uVar6 & 1) != 0) {
          uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
        }
        if (local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ == uVar6) {
          SourceCodeInfo::InternalSwap(&local_78,other);
        }
        else {
          internal::GenericSwap(&local_78.super_Message,&other->super_Message);
        }
      }
      bVar8 = this->had_errors_ ^ 1;
      goto LAB_001cf473;
    }
    bVar8 = this->had_errors_ ^ 1;
  }
  else {
LAB_001cf291:
    bVar3 = ParseSyntaxIdentifier(this,file,&local_90);
    if (bVar3) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)&file->field_0 = *(byte *)&file->field_0 | 4;
        pAVar7 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(file->field_0)._impl_.syntax_,value,pAVar7);
        iVar4 = std::__cxx11::string::compare((char *)value);
        if (iVar4 == 0) {
          value_00 = this->edition_;
          bVar3 = Edition_IsValid(value_00);
          if (!bVar3) {
            __assert_fail("::google::protobuf::Edition_IsValid(value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                          ,0x3253,
                          "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                         );
          }
          (file->field_0)._impl_.edition_ = value_00;
          *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x20;
        }
      }
      goto LAB_001cf35b;
    }
    bVar8 = 0;
  }
  LocationRecorder::~LocationRecorder(&local_90);
LAB_001cf473:
  SourceCodeInfo::~SourceCodeInfo(&local_78);
  return (bool)bVar8;
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax") ||
        LookingAt("edition")) {
      if (!ParseSyntaxIdentifier(file, root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != nullptr) {
        file->set_syntax(syntax_identifier_);
        if (syntax_identifier_ == "editions") {
          file->set_edition(edition_);
        }
      }
    } else if (!stop_after_syntax_identifier_) {
      ABSL_LOG(WARNING) << "No syntax specified for the proto file: "
                        << file->name()
                        << ". Please use 'syntax = \"proto2\";' "
                        << "or 'syntax = \"proto3\";' to specify a syntax "
                        << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          RecordError("Unmatched \"}\".");
          input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = nullptr;
  source_code_info_ = nullptr;
  assert(file != nullptr);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}